

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,long64 topY)

{
  pointer ppHVar1;
  HorzJoinRec *pHVar2;
  TEdge *e2;
  long lVar3;
  long lVar4;
  long lVar5;
  IntPoint pt1a;
  IntPoint pt1b;
  IntPoint pt2a;
  IntPoint pt2;
  IntPoint pt2_00;
  IntPoint pt4;
  IntPoint pt2b;
  IntPoint pt4_00;
  bool bVar6;
  TEdge *pTVar7;
  long64 lVar8;
  size_type i;
  ulong uVar9;
  TEdge **ppTVar10;
  long lVar11;
  TEdge *pTVar12;
  IntPoint pt1;
  IntPoint pt1_00;
  IntPoint pt3;
  IntPoint pt3_00;
  TEdge *local_a0;
  IntPoint local_98;
  long local_88;
  TEdge **local_80;
  long64 local_78;
  long lStack_70;
  long64 local_68;
  long64 lStack_60;
  long64 local_58;
  long64 lStack_50;
  IntPoint local_48;
  
  local_80 = &this->m_ActiveEdges;
  ppTVar10 = local_80;
  local_88 = topY;
LAB_00585938:
  lVar11 = local_88;
  pTVar12 = *ppTVar10;
  local_a0 = pTVar12;
  if (pTVar12 != (TEdge *)0x0) {
    if (pTVar12->ytop == local_88) {
      if ((pTVar12->nextInLML == (TEdge *)0x0) &&
         (pTVar7 = GetMaximaPair(pTVar12), 1e-20 <= ABS(pTVar7->dx + 1e+40))) {
        pTVar7 = pTVar12->prevInAEL;
        DoMaxima(this,pTVar12,lVar11);
        ppTVar10 = &pTVar7->nextInAEL;
        if (pTVar7 == (TEdge *)0x0) {
          ppTVar10 = local_80;
        }
        goto LAB_00585938;
      }
      if ((pTVar12->nextInLML == (TEdge *)0x0) || (1e-20 <= ABS(pTVar12->nextInLML->dx + 1e+40)))
      goto LAB_00585a96;
      if (-1 < pTVar12->outIdx) {
        local_98.X = pTVar12->xtop;
        local_98.Y = lVar11;
        AddOutPt(this,pTVar12,&local_98);
        for (uVar9 = 0;
            ppHVar1 = (this->m_HorizJoins).
                      super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar9 < (ulong)((long)(this->m_HorizJoins).
                                  super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar1 >> 3);
            uVar9 = uVar9 + 1) {
          local_98.X = 0;
          local_98.Y = 0;
          local_48.X = 0;
          local_48.Y = 0;
          pHVar2 = ppHVar1[uVar9];
          pTVar7 = pHVar2->edge;
          pt1a.X = pTVar7->xbot;
          pt1a.Y = pTVar7->ybot;
          pt1b.X = pTVar7->xtop;
          pt1b.Y = pTVar7->ytop;
          e2 = pTVar12->nextInLML;
          pt2a.X = e2->xbot;
          pt2a.Y = e2->ybot;
          local_58 = e2->xtop;
          lStack_50 = e2->ytop;
          pt2b.X = e2->xtop;
          pt2b.Y = e2->ytop;
          bVar6 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_98,&local_48);
          if (bVar6) {
            AddJoin(this,pTVar7,e2,pHVar2->savedIdx,pTVar12->outIdx);
          }
        }
        AddHorzJoin(this,pTVar12->nextInLML,pTVar12->outIdx);
      }
      UpdateEdgeIntoAEL(this,&local_a0);
      pTVar12 = local_a0;
      AddEdgeToSEL(this,local_a0);
    }
    else {
LAB_00585a96:
      lVar8 = TopX(pTVar12,lVar11);
      pTVar12->xcurr = lVar8;
      pTVar12->ycurr = lVar11;
    }
    ppTVar10 = &pTVar12->nextInAEL;
    goto LAB_00585938;
  }
  ProcessHorizontals(this);
  lVar11 = local_88;
  ppTVar10 = local_80;
  do {
    pTVar12 = *ppTVar10;
    if (pTVar12 == (TEdge *)0x0) {
      return;
    }
    if ((pTVar12->ytop == lVar11) && (pTVar12->nextInLML != (TEdge *)0x0)) {
      local_a0 = pTVar12;
      if (-1 < pTVar12->outIdx) {
        local_98.X = pTVar12->xtop;
        local_98.Y = lVar11;
        AddOutPt(this,pTVar12,&local_98);
      }
      UpdateEdgeIntoAEL(this,&local_a0);
      pTVar12 = local_a0;
      if (-1 < local_a0->outIdx) {
        pTVar7 = local_a0->prevInAEL;
        if ((((pTVar7 == (TEdge *)0x0) || (pTVar7->outIdx < 0)) ||
            (lVar3 = pTVar7->xcurr, lVar3 != local_a0->xbot)) ||
           (lVar4 = pTVar7->ycurr, lVar4 != local_a0->ybot)) {
LAB_00585c33:
          pTVar7 = pTVar12->nextInAEL;
          if ((pTVar7 != (TEdge *)0x0) && (-1 < pTVar7->outIdx)) {
            lVar3 = pTVar7->ycurr;
            lVar4 = pTVar7->ytop;
            if (((lVar4 < lVar3) &&
                ((lVar3 <= pTVar7->ybot && (lVar5 = pTVar7->xcurr, lVar5 == pTVar12->xbot)))) &&
               (lVar3 == pTVar12->ybot)) {
              pt2_00.X = pTVar12->xtop;
              pt2_00.Y = pTVar12->ytop;
              local_78 = pTVar7->xtop;
              pt4.Y = lVar4;
              pt4.X = local_78;
              pt1_00.Y = lVar3;
              pt1_00.X = lVar5;
              pt3_00.Y = lVar3;
              pt3_00.X = lVar5;
              lStack_70 = lVar4;
              bVar6 = SlopesEqual(pt1_00,pt2_00,pt3_00,pt4,
                                  (bool)(this->_vptr_Clipper[-3] + 0x10)
                                        [(long)&(this->m_PolyOuts).
                                                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                        ]);
              if (bVar6) {
                ppTVar10 = &pTVar12->nextInAEL;
                pTVar7 = pTVar12->nextInAEL;
                goto LAB_00585bf9;
              }
            }
          }
        }
        else {
          pt2.X = local_a0->xtop;
          pt2.Y = local_a0->ytop;
          local_68 = pTVar7->xtop;
          lStack_60 = pTVar7->ytop;
          pt4_00.X = pTVar7->xtop;
          pt4_00.Y = pTVar7->ytop;
          pt1.Y = lVar4;
          pt1.X = lVar3;
          pt3.Y = lVar4;
          pt3.X = lVar3;
          bVar6 = SlopesEqual(pt1,pt2,pt3,pt4_00,
                              (bool)(this->_vptr_Clipper[-3] + 0x10)
                                    [(long)&(this->m_PolyOuts).
                                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                    ]);
          if (!bVar6) {
            if (pTVar12->outIdx < 0) goto LAB_00585cb2;
            goto LAB_00585c33;
          }
          ppTVar10 = &pTVar12->prevInAEL;
          pTVar7 = pTVar12->prevInAEL;
LAB_00585bf9:
          local_98.X = pTVar12->xbot;
          local_98.Y = pTVar12->ybot;
          AddOutPt(this,pTVar7,&local_98);
          AddJoin(this,pTVar12,*ppTVar10,-1,-1);
          lVar11 = local_88;
        }
      }
    }
LAB_00585cb2:
    ppTVar10 = &pTVar12->nextInAEL;
  } while( true );
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const long64 topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    if( IsMaxima(e, topY) && !NEAR_EQUAL(GetMaximaPair(e)->dx, HORIZONTAL) )
    {
      //'e' might be removed from AEL, as may any following edges so ...
      TEdge* ePrior = e->prevInAEL;
      DoMaxima(e, topY);
      if( !ePrior ) e = m_ActiveEdges;
      else e = ePrior->nextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update xcurr and ycurr ...
      if(  IsIntermediate(e, topY) && NEAR_EQUAL(e->nextInLML->dx, HORIZONTAL) )
      {
        if (e->outIdx >= 0)
        {
          AddOutPt(e, IntPoint(e->xtop, e->ytop));

          for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
          {
            IntPoint pt, pt2;
            HorzJoinRec* hj = m_HorizJoins[i];
            if (GetOverlapSegment(IntPoint(hj->edge->xbot, hj->edge->ybot),
              IntPoint(hj->edge->xtop, hj->edge->ytop),
              IntPoint(e->nextInLML->xbot, e->nextInLML->ybot),
              IntPoint(e->nextInLML->xtop, e->nextInLML->ytop), pt, pt2))
                AddJoin(hj->edge, e->nextInLML, hj->savedIdx, e->outIdx);
          }

          AddHorzJoin(e->nextInLML, e->outIdx);
        }
        UpdateEdgeIntoAEL(e);
        AddEdgeToSEL(e);
      } else
      {
        //this just simplifies horizontal processing ...
        e->xcurr = TopX( *e, topY );
        e->ycurr = topY;
      }
      e = e->nextInAEL;
    }
  }

  //3. Process horizontals at the top of the scanbeam ...
  ProcessHorizontals();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while( e )
  {
    if( IsIntermediate( e, topY ) )
    {
      if( e->outIdx >= 0 ) AddOutPt(e, IntPoint(e->xtop,e->ytop));
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      if (e->outIdx >= 0 && e->prevInAEL && e->prevInAEL->outIdx >= 0 &&
        e->prevInAEL->xcurr == e->xbot && e->prevInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->prevInAEL->xtop, e->prevInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->prevInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->prevInAEL);
      }
      else if (e->outIdx >= 0 && e->nextInAEL && e->nextInAEL->outIdx >= 0 &&
        e->nextInAEL->ycurr > e->nextInAEL->ytop &&
        e->nextInAEL->ycurr <= e->nextInAEL->ybot &&
        e->nextInAEL->xcurr == e->xbot && e->nextInAEL->ycurr == e->ybot &&
        SlopesEqual(IntPoint(e->xbot,e->ybot), IntPoint(e->xtop, e->ytop),
          IntPoint(e->xbot,e->ybot),
          IntPoint(e->nextInAEL->xtop, e->nextInAEL->ytop), m_UseFullRange))
      {
        AddOutPt(e->nextInAEL, IntPoint(e->xbot, e->ybot));
        AddJoin(e, e->nextInAEL);
      }
    }
    e = e->nextInAEL;
  }
}